

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::ChangeRPath
               (string *file,string *oldRPath,string *newRPath,bool removeEnvironmentRPath,
               string *emsg,bool *changed)

{
  optional<bool> oVar1;
  __0 *this;
  _Storage<bool,_true> _Var2;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_cmELF_&)>
  local_98;
  anon_class_72_3_ec058f21 adjustCallback;
  
  std::__cxx11::string::string((string *)&adjustCallback,(string *)oldRPath);
  std::__cxx11::string::string((string *)&adjustCallback.newRPath,(string *)newRPath);
  adjustCallback.removeEnvironmentRPath = removeEnvironmentRPath;
  anon_unknown.dwarf_991787::MakeEmptyCallback(&local_98,newRPath);
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  this = (__0 *)operator_new(0x48);
  ChangeRPathELF(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,std::__cxx11::string*,bool*)
  ::$_0::__0(this,&adjustCallback);
  pcStack_a0 = std::
               _Function_handler<bool_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:2971:25)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<bool_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:2971:25)>
             ::_M_manager;
  local_b8._M_unused._0_8_ = (undefined8)this;
  oVar1 = anon_unknown.dwarf_991787::AdjustRPathELF
                    (file,&local_98,(AdjustCallback *)&local_b8,emsg,changed);
  _Var2._M_value =
       oVar1.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>.
       _M_payload;
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  std::_Function_base::~_Function_base(&local_98.super__Function_base);
  ChangeRPathELF(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,std::__cxx11::string*,bool*)
  ::$_0::~__0((__0 *)&adjustCallback);
  if (((ushort)oVar1.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> >> 8 & 1) == 0) {
    if (changed != (bool *)0x0) {
      *changed = false;
    }
    if (newRPath->_M_string_length == 0) {
      _Var2._M_value = true;
    }
    else {
      if (emsg != (string *)0x0) {
        std::__cxx11::string::assign((char *)emsg);
      }
      _Var2._M_value = false;
    }
  }
  return (bool)(_Var2._M_value & 1);
}

Assistant:

bool cmSystemTools::ChangeRPath(std::string const& file,
                                std::string const& oldRPath,
                                std::string const& newRPath,
                                bool removeEnvironmentRPath, std::string* emsg,
                                bool* changed)
{
  if (cm::optional<bool> result = ChangeRPathELF(
        file, oldRPath, newRPath, removeEnvironmentRPath, emsg, changed)) {
    return result.value();
  }
  if (cm::optional<bool> result = ChangeRPathXCOFF(
        file, oldRPath, newRPath, removeEnvironmentRPath, emsg, changed)) {
    return result.value();
  }
  // The file format is not recognized.  Assume it has no RPATH.
  if (newRPath.empty()) {
    // The caller wanted no RPATH anyway.
    return true;
  }
  if (emsg) {
    *emsg = "The file format is not recognized.";
  }
  return false;
}